

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O2

void BrotliSplitBlock(MemoryManager *m,Command_conflict *cmds,size_t num_commands,uint8_t *data,
                     size_t pos,size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  char *pcVar2;
  long *plVar3;
  uint uVar4;
  ushort uVar5;
  size_t byte_ix;
  size_t sVar6;
  uint8_t *puVar7;
  uint32_t *puVar8;
  HistogramLiteral *out;
  HistogramLiteral *pHVar9;
  void *pvVar10;
  void *pvVar11;
  HistogramCommand *pHVar12;
  ulong uVar13;
  ushort *puVar14;
  void *pvVar15;
  double *pdVar16;
  void *pvVar17;
  void *pvVar18;
  long lVar19;
  void *pvVar20;
  ulong uVar21;
  HistogramDistance *pHVar22;
  uint32_t *puVar23;
  int iVar24;
  Command_conflict *pCVar25;
  long lVar26;
  size_t sVar27;
  byte bVar28;
  byte *pbVar29;
  uint *puVar30;
  ulong uVar31;
  double *pdVar32;
  long lVar33;
  byte bVar34;
  ulong uVar35;
  uint32_t uVar36;
  uint16_t *puVar37;
  ulong uVar38;
  ulong uVar39;
  size_t __n;
  long lVar40;
  size_t __n_00;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  HistogramCommand *local_1000;
  long local_ff8;
  HistogramDistance *local_ff0;
  ulong local_fe8;
  HistogramCommand *local_fe0;
  uint32_t *local_fd8;
  size_t total_length;
  ulong local_fc8;
  ulong local_fc0;
  uint32_t *local_fb8;
  uint32_t *local_fb0;
  void *local_fa8;
  void *local_fa0;
  uint32_t *local_f90;
  HistogramPair *local_f78;
  ulong local_f70;
  HistogramPair *local_f60;
  long local_f50;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [2176];
  ulong local_2c0;
  double local_2b8;
  ulong local_40;
  double local_38;
  
  total_length = 0;
  sVar6 = num_commands;
  pCVar25 = cmds;
  while (bVar45 = sVar6 != 0, sVar6 = sVar6 - 1, bVar45) {
    total_length = total_length + pCVar25->insert_len_;
    pCVar25 = pCVar25 + 1;
  }
  if (total_length == 0) {
    local_fd8 = (uint32_t *)0x0;
  }
  else {
    local_fd8 = (uint32_t *)BrotliAllocate(m,total_length);
  }
  puVar8 = &cmds->copy_len_;
  lVar41 = 0;
  sVar6 = num_commands;
  while (bVar45 = sVar6 != 0, sVar6 = sVar6 - 1, bVar45) {
    uVar43 = pos & mask;
    __n = (size_t)((Command_conflict *)(puVar8 + -1))->insert_len_;
    if (mask < uVar43 + __n) {
      __n_00 = (mask + 1) - uVar43;
      memcpy((void *)((long)local_fd8 + lVar41),data + uVar43,__n_00);
      lVar41 = lVar41 + __n_00;
      __n = __n - __n_00;
      uVar43 = 0;
    }
    if (__n != 0) {
      memcpy((void *)((long)local_fd8 + lVar41),data + uVar43,__n);
      lVar41 = lVar41 + __n;
    }
    pos = (ulong)(*puVar8 & 0x1ffffff) + __n + uVar43;
    puVar8 = puVar8 + 4;
  }
  local_ff0 = (HistogramDistance *)100;
  if (total_length < 0xd480) {
    local_ff0 = (HistogramDistance *)(ulong)(ushort)((ushort)total_length / 0x220 + 1);
  }
  local_f50 = 3;
  if (total_length == 0) {
    literal_split->num_types = 1;
  }
  else {
    if (0x7f < total_length) {
      uVar43 = 7;
      pvVar10 = BrotliAllocate(m,(long)local_ff0 * 0x410);
      for (lVar41 = 0; (long)local_ff0 * 0x410 - lVar41 != 0; lVar41 = lVar41 + 0x410) {
        memset((void *)((long)pvVar10 + lVar41),0,0x408);
        *(undefined8 *)((long)pvVar10 + lVar41 + 0x408) = 0x7ff0000000000000;
      }
      for (uVar39 = 0; (HistogramDistance *)uVar39 != local_ff0; uVar39 = uVar39 + 1) {
        uVar13 = (uVar39 * total_length) / (ulong)local_ff0;
        if (uVar39 != 0) {
          uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
          uVar13 = uVar13 + uVar43 % (total_length / (ulong)local_ff0);
        }
        if (total_length <= uVar13 + 0x46) {
          uVar13 = total_length - 0x47;
        }
        plVar3 = (long *)((long)pvVar10 + uVar39 * 0x410 + 0x400);
        *plVar3 = *plVar3 + 0x46;
        for (lVar41 = -0x46; lVar41 != 0; lVar41 = lVar41 + 1) {
          piVar1 = (int *)((long)pvVar10 +
                          (ulong)*(byte *)((long)local_fd8 + lVar41 + uVar13 + 0x46) * 4 +
                          uVar39 * 0x410);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar13 = (total_length * 2) / 0x46 + (long)local_ff0 + 99;
      uVar43 = 7;
      for (uVar39 = 0; uVar39 < uVar13 - uVar13 % (ulong)local_ff0; uVar39 = uVar39 + 1) {
        memset(local_b40,0,0x408);
        uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
        pbVar29 = (byte *)(uVar43 % (total_length - 0x45) + (long)local_fd8);
        for (lVar41 = -0x46; lVar41 != 0; lVar41 = lVar41 + 1) {
          bVar28 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          *(int *)(local_b40 + (ulong)bVar28 * 4) = *(int *)(local_b40 + (ulong)bVar28 * 4) + 1;
        }
        lVar41 = (uVar39 % (ulong)local_ff0) * 0x410;
        plVar3 = (long *)((long)pvVar10 + lVar41 + 0x400);
        *plVar3 = *plVar3 + 0x46;
        for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 1) {
          piVar1 = (int *)((long)pvVar10 + lVar26 * 4 + lVar41);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
        }
      }
      pvVar15 = BrotliAllocate(m,total_length);
      iVar24 = (int)local_ff0;
      pdVar16 = (double *)BrotliAllocate(m,(ulong)(uint)(iVar24 << 0xb));
      pvVar17 = BrotliAllocate(m,(ulong)(uint)(iVar24 * 8));
      sVar6 = (iVar24 + 7U >> 3) * total_length;
      if (sVar6 == 0) {
        local_fa0 = (void *)0x0;
      }
      else {
        local_fa0 = BrotliAllocate(m,sVar6);
      }
      pvVar18 = BrotliAllocate(m,(ulong)(uint)(iVar24 * 2));
      lVar41 = 3;
      if (10 < params->quality) {
        lVar41 = 10;
      }
      local_fc0 = 0;
      for (lVar26 = 0; lVar26 != lVar41; lVar26 = lVar26 + 1) {
        if (local_ff0 < 2) {
          for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar15 + sVar6) = 0;
          }
          local_fc0 = 1;
        }
        else {
          uVar43 = (long)local_ff0 + 7U >> 3;
          memset(pdVar16,0,(long)local_ff0 << 0xb);
          puVar30 = (uint *)((long)pvVar10 + 0x400);
          for (uVar39 = 0; local_ff0 != (HistogramDistance *)uVar39; uVar39 = uVar39 + 1) {
            uVar13 = (ulong)*puVar30;
            if (uVar13 < 0x100) {
              dVar46 = (double)kLog2Table[uVar13];
            }
            else {
              dVar46 = log2((double)uVar13);
            }
            pdVar16[uVar39] = dVar46;
            puVar30 = puVar30 + 0x104;
          }
          lVar40 = (long)local_ff0 * 0x7f8;
          lVar44 = 0x100;
          lVar19 = (long)pvVar10 + 0x3fc;
          while (bVar45 = lVar44 != 0, lVar44 = lVar44 + -1, bVar45) {
            pdVar32 = pdVar16;
            for (lVar33 = 0; (long)local_ff0 * 0x82 - lVar33 != 0; lVar33 = lVar33 + 0x82) {
              dVar46 = *pdVar32;
              uVar4 = *(uint *)(lVar19 + lVar33 * 8);
              uVar39 = (ulong)uVar4;
              dVar47 = -2.0;
              if (uVar39 != 0) {
                if (uVar4 < 0x100) {
                  dVar47 = (double)kLog2Table[uVar39];
                }
                else {
                  dVar47 = log2((double)uVar39);
                }
              }
              *(double *)((long)pdVar32 + lVar40) = dVar46 - dVar47;
              pdVar32 = pdVar32 + 1;
            }
            lVar40 = lVar40 + (long)local_ff0 * -8;
            lVar19 = lVar19 + -4;
          }
          memset(pvVar17,0,(long)local_ff0 * 8);
          memset(local_fa0,0,uVar43 * total_length);
          for (uVar39 = 0; uVar39 != total_length; uVar39 = uVar39 + 1) {
            bVar28 = *(byte *)((long)local_fd8 + uVar39);
            dVar46 = 1e+99;
            for (uVar13 = 0; local_ff0 != (HistogramDistance *)uVar13; uVar13 = uVar13 + 1) {
              dVar47 = pdVar16[(ulong)bVar28 * (long)local_ff0 + uVar13] +
                       *(double *)((long)pvVar17 + uVar13 * 8);
              *(double *)((long)pvVar17 + uVar13 * 8) = dVar47;
              if (dVar47 < dVar46) {
                *(char *)((long)pvVar15 + uVar39) = (char)uVar13;
                dVar46 = dVar47;
              }
            }
            dVar47 = 28.1;
            if (uVar39 < 2000) {
              dVar47 = (((double)(long)uVar39 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            for (uVar13 = 0; local_ff0 != (HistogramDistance *)uVar13; uVar13 = uVar13 + 1) {
              dVar48 = *(double *)((long)pvVar17 + uVar13 * 8) - dVar46;
              *(double *)((long)pvVar17 + uVar13 * 8) = dVar48;
              if (dVar47 <= dVar48) {
                *(double *)((long)pvVar17 + uVar13 * 8) = dVar47;
                pbVar29 = (byte *)((long)local_fa0 + (uVar13 >> 3) + uVar39 * uVar43);
                *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar13 & 7);
              }
            }
          }
          bVar28 = *(byte *)((long)pvVar15 + (total_length - 1));
          pvVar20 = (void *)((total_length - 2) * uVar43 + (long)local_fa0);
          local_fc0 = 1;
          for (sVar6 = total_length; sVar6 != 1; sVar6 = sVar6 - 1) {
            if ((*(byte *)((long)pvVar20 + (ulong)(bVar28 >> 3)) >> (bVar28 & 7) & 1) != 0) {
              bVar34 = *(byte *)((long)pvVar15 + (sVar6 - 2));
              local_fc0 = local_fc0 + (bVar28 != bVar34);
              bVar28 = bVar34;
            }
            *(byte *)((long)pvVar15 + (sVar6 - 2)) = bVar28;
            pvVar20 = (void *)((long)pvVar20 - uVar43);
          }
        }
        for (uVar43 = 0; local_ff0 != (HistogramDistance *)uVar43; uVar43 = uVar43 + 1) {
          *(undefined2 *)((long)pvVar18 + uVar43 * 2) = 0x100;
        }
        uVar5 = 0;
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          if (*(short *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar15 + sVar6) * 2) == 0x100) {
            *(ushort *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar15 + sVar6) * 2) = uVar5;
            uVar5 = uVar5 + 1;
          }
        }
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          *(undefined1 *)((long)pvVar15 + sVar6) =
               *(undefined1 *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar15 + sVar6) * 2);
        }
        local_ff0 = (HistogramDistance *)(ulong)uVar5;
        for (lVar19 = 0; (long)local_ff0 * 0x410 - lVar19 != 0; lVar19 = lVar19 + 0x410) {
          memset((void *)((long)pvVar10 + lVar19),0,0x408);
          *(undefined8 *)((long)pvVar10 + lVar19 + 0x408) = 0x7ff0000000000000;
        }
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          lVar19 = (ulong)*(byte *)((long)pvVar15 + sVar6) * 0x410;
          piVar1 = (int *)((long)pvVar10 + (ulong)*(byte *)((long)local_fd8 + sVar6) * 4 + lVar19);
          *piVar1 = *piVar1 + 1;
          plVar3 = (long *)((long)pvVar10 + lVar19 + 0x400);
          *plVar3 = *plVar3 + 1;
        }
      }
      BrotliFree(m,pdVar16);
      BrotliFree(m,pvVar17);
      BrotliFree(m,local_fa0);
      BrotliFree(m,pvVar18);
      BrotliFree(m,pvVar10);
      if (local_fc0 == 0) {
        local_fb0 = (uint32_t *)0x0;
        pvVar10 = (void *)0x0;
      }
      else {
        local_fb0 = (uint32_t *)BrotliAllocate(m,local_fc0 * 4);
        pvVar10 = BrotliAllocate(m,local_fc0 * 4);
      }
      uVar39 = local_fc0 * 0x10 + 0x3f0;
      uVar43 = uVar39 >> 6;
      if (uVar39 < 0x40) {
        out = (HistogramLiteral *)0x0;
        local_fb8 = (uint32_t *)0x0;
      }
      else {
        out = (HistogramLiteral *)BrotliAllocate(m,uVar43 * 0x410);
        local_fb8 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
      }
      if (local_fc0 == 0) {
        local_fe0 = (HistogramCommand *)0x0;
      }
      else {
        uVar39 = 0x40;
        if (local_fc0 < 0x40) {
          uVar39 = local_fc0;
        }
        local_fe0 = (HistogramCommand *)BrotliAllocate(m,uVar39 * 0x410);
      }
      local_f60 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar10,0,local_fc0 * 4);
      lVar41 = 0;
      sVar6 = 0;
      while (sVar27 = sVar6 + 1, sVar27 - total_length != 1) {
        piVar1 = (int *)((long)pvVar10 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar27 == total_length) ||
           (pcVar2 = (char *)((long)pvVar15 + sVar6), sVar6 = sVar27,
           *pcVar2 != *(char *)((long)pvVar15 + sVar27))) {
          lVar41 = lVar41 + 1;
          sVar6 = sVar27;
        }
      }
      local_ff8 = 0;
      local_f90 = local_fb0;
      uVar13 = 0;
      uVar38 = 0;
      local_fa8 = (void *)0x0;
      local_fa0 = (void *)0x0;
      uVar39 = local_fc0;
      local_f70 = uVar43;
      while( true ) {
        uVar21 = 0x40;
        if (uVar39 < 0x40) {
          uVar21 = uVar39;
        }
        uVar35 = local_fc0 - uVar38;
        if (local_fc0 < uVar38 || uVar35 == 0) break;
        for (uVar31 = 0; uVar31 != uVar21; uVar31 = uVar31 + 1) {
          pHVar9 = (HistogramLiteral *)((long)local_fe0 + uVar31 * 0x410);
          memset(pHVar9,0,0x408);
          ((HistogramLiteral *)((long)local_fe0 + uVar31 * 0x410))->bit_cost_ = INFINITY;
          uVar42 = 0;
          while (uVar42 < *(uint *)((long)pvVar10 + (uVar38 + uVar31) * 4)) {
            pHVar9->data_[*(byte *)((long)local_fd8 + uVar42 + local_ff8)] =
                 pHVar9->data_[*(byte *)((long)local_fd8 + uVar42 + local_ff8)] + 1;
            uVar42 = uVar42 + 1;
            pHVar9->total_count_ = uVar42;
          }
          dVar46 = BrotliPopulationCostLiteral(pHVar9);
          pHVar9->bit_cost_ = dVar46;
          new_clusters[uVar31] = (uint32_t)uVar31;
          symbols[uVar31] = (uint32_t)uVar31;
          sizes[uVar31] = 1;
          local_ff8 = local_ff8 + uVar42;
        }
        if (0x3f < uVar35) {
          uVar35 = 0x40;
        }
        sVar6 = BrotliHistogramCombineLiteral
                          ((HistogramLiteral *)local_fe0,sizes,symbols,new_clusters,local_f60,uVar35
                           ,uVar35,0x40,0x800);
        uVar35 = (long)local_fa0 + sVar6;
        if (uVar43 < uVar35) {
          uVar31 = uVar43;
          if (uVar43 == 0) {
            uVar31 = uVar35;
          }
          do {
            uVar42 = uVar31;
            uVar31 = uVar42 * 2;
          } while (uVar42 < uVar35);
          pHVar9 = (HistogramLiteral *)BrotliAllocate(m,uVar42 * 0x410);
          if (uVar43 != 0) {
            memcpy(pHVar9,out,uVar43 * 0x410);
          }
          BrotliFree(m,out);
          out = pHVar9;
          uVar43 = uVar42;
        }
        uVar35 = (long)local_fa8 + sVar6;
        if (local_f70 < uVar35) {
          uVar31 = local_f70;
          if (local_f70 == 0) {
            uVar31 = uVar35;
          }
          do {
            uVar42 = uVar31;
            uVar31 = uVar42 * 2;
          } while (uVar42 < uVar35);
          puVar8 = (uint32_t *)BrotliAllocate(m,uVar42 * 4);
          if (local_f70 != 0) {
            memcpy(puVar8,local_fb8,local_f70 << 2);
          }
          BrotliFree(m,local_fb8);
          local_f70 = uVar42;
          local_fb8 = puVar8;
        }
        pHVar9 = out + (long)local_fa0;
        for (sVar27 = 0; sVar6 != sVar27; sVar27 = sVar27 + 1) {
          uVar4 = new_clusters[sVar27];
          memcpy(pHVar9,(HistogramLiteral *)((long)local_fe0 + (ulong)uVar4 * 0x410),0x410);
          local_fb8[(long)local_fa8 + sVar27] = sizes[uVar4];
          remap[new_clusters[sVar27]] = (uint32_t)sVar27;
          pHVar9 = pHVar9 + 1;
        }
        local_fa8 = (void *)((long)local_fa8 + sVar27);
        local_fa0 = (void *)((long)local_fa0 + sVar27);
        for (uVar35 = 0; uVar21 != uVar35; uVar35 = uVar35 + 1) {
          local_fe8._0_4_ = (int)uVar13;
          local_f90[uVar35] = remap[symbols[uVar35]] + (int)local_fe8;
        }
        uVar13 = uVar13 + sVar6;
        uVar38 = uVar38 + 0x40;
        uVar39 = uVar39 - 0x40;
        local_f90 = local_f90 + 0x40;
      }
      BrotliFree(m,local_fe0);
      uVar43 = (uVar13 >> 1) * uVar13;
      if (uVar13 << 6 < uVar43) {
        uVar43 = uVar13 << 6;
      }
      if (0x800 < uVar43) {
        BrotliFree(m,local_f60);
        local_f60 = (HistogramPair *)BrotliAllocate(m,uVar43 * 0x18 + 0x18);
      }
      if (uVar13 == 0) {
        puVar8 = (uint32_t *)0x0;
      }
      else {
        puVar8 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      }
      for (uVar39 = 0; uVar13 != uVar39; uVar39 = uVar39 + 1) {
        puVar8[uVar39] = (uint32_t)uVar39;
      }
      sVar6 = BrotliHistogramCombineLiteral
                        (out,local_fb8,local_fb0,puVar8,local_f60,uVar13,local_fc0,0x100,uVar43);
      BrotliFree(m,local_f60);
      BrotliFree(m,local_fb8);
      if (uVar13 == 0) {
        pvVar17 = (void *)0x0;
      }
      else {
        pvVar17 = BrotliAllocate(m,uVar13 * 4);
      }
      for (uVar43 = 0; uVar13 != uVar43; uVar43 = uVar43 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar43 * 4) = 0xffffffff;
      }
      local_ff8 = 0;
      iVar24 = 0;
      for (uVar43 = 0; uVar43 != local_fc0; uVar43 = uVar43 + 1) {
        memset(local_b40,0,0x408);
        local_b40._1032_8_ = INFINITY;
        uVar39 = 0;
        while (uVar39 < *(uint *)((long)pvVar10 + uVar43 * 4)) {
          *(int *)(local_b40 + (ulong)*(byte *)((long)local_fd8 + uVar39 + local_ff8) * 4) =
               *(int *)(local_b40 + (ulong)*(byte *)((long)local_fd8 + uVar39 + local_ff8) * 4) + 1;
          uVar39 = uVar39 + 1;
          local_b40._1024_8_ = uVar39;
        }
        lVar41 = uVar43 - 1;
        if (uVar43 == 0) {
          lVar41 = 0;
        }
        uVar13 = (ulong)local_fb0[lVar41];
        local_fe0 = (HistogramCommand *)
                    BrotliHistogramBitCostDistanceLiteral
                              ((HistogramLiteral *)local_b40,out + uVar13);
        local_ff8 = local_ff8 + uVar39;
        for (sVar27 = 0; sVar6 != sVar27; sVar27 = sVar27 + 1) {
          dVar46 = BrotliHistogramBitCostDistanceLiteral
                             ((HistogramLiteral *)local_b40,out + puVar8[sVar27]);
          if (dVar46 < (double)local_fe0) {
            uVar13 = (ulong)puVar8[sVar27];
            local_fe0 = (HistogramCommand *)dVar46;
          }
        }
        local_fb0[uVar43] = (uint32_t)uVar13;
        if (*(int *)((long)pvVar17 + uVar13 * 4) == -1) {
          *(int *)((long)pvVar17 + uVar13 * 4) = iVar24;
          iVar24 = iVar24 + 1;
        }
      }
      BrotliFree(m,puVar8);
      BrotliFree(m,out);
      uVar43 = literal_split->types_alloc_size;
      if (uVar43 < local_fc0) {
        if (uVar43 == 0) {
          uVar43 = local_fc0;
        }
        do {
          uVar39 = uVar43;
          uVar43 = uVar39 * 2;
        } while (uVar39 < local_fc0);
        puVar7 = (uint8_t *)BrotliAllocate(m,uVar39);
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar7,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar7;
        literal_split->types_alloc_size = uVar39;
      }
      uVar43 = literal_split->lengths_alloc_size;
      if (uVar43 < local_fc0) {
        if (uVar43 == 0) {
          uVar43 = local_fc0;
        }
        do {
          uVar39 = uVar43;
          uVar43 = uVar39 * 2;
        } while (uVar39 < local_fc0);
        puVar8 = (uint32_t *)BrotliAllocate(m,uVar39 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar8,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar8;
        literal_split->lengths_alloc_size = uVar39;
      }
      uVar39 = 0;
      sVar6 = 0;
      uVar43 = 0;
      do {
        uVar36 = 0;
        uVar13 = uVar39;
        do {
          uVar39 = uVar13 + 1;
          uVar38 = uVar43 & 0xff;
          if (uVar39 - local_fc0 == 1) {
            literal_split->num_blocks = sVar6;
            literal_split->num_types = uVar38 + 1;
            BrotliFree(m,pvVar17);
            BrotliFree(m,pvVar10);
            BrotliFree(m,local_fb0);
            BrotliFree(m,pvVar15);
            goto LAB_0011af5d;
          }
          uVar36 = uVar36 + *(int *)((long)pvVar10 + uVar39 * 4 + -4);
          puVar30 = local_fb0 + uVar13;
        } while ((uVar39 != local_fc0) && (uVar13 = uVar39, *puVar30 == local_fb0[uVar39]));
        uVar4 = *(uint *)((long)pvVar17 + (ulong)*puVar30 * 4);
        bVar28 = (byte)uVar4;
        literal_split->types[sVar6] = bVar28;
        literal_split->lengths[sVar6] = uVar36;
        bVar34 = (byte)uVar43;
        uVar43 = (ulong)uVar4;
        if (bVar28 < bVar34) {
          uVar43 = uVar38;
        }
        sVar6 = sVar6 + 1;
      } while( true );
    }
    sVar6 = literal_split->num_blocks;
    uVar39 = literal_split->types_alloc_size;
    uVar43 = sVar6 + 1;
    if (uVar39 < uVar43) {
      if (uVar39 == 0) {
        uVar39 = uVar43;
      }
      do {
        uVar13 = uVar39;
        uVar39 = uVar13 * 2;
      } while (uVar13 < uVar43);
      puVar7 = (uint8_t *)BrotliAllocate(m,uVar13);
      if (literal_split->types_alloc_size != 0) {
        memcpy(puVar7,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar7;
      literal_split->types_alloc_size = uVar13;
      sVar6 = literal_split->num_blocks;
      uVar43 = sVar6 + 1;
    }
    uVar39 = literal_split->lengths_alloc_size;
    if (uVar39 < uVar43) {
      if (uVar39 == 0) {
        uVar39 = uVar43;
      }
      do {
        uVar13 = uVar39;
        uVar39 = uVar13 * 2;
      } while (uVar13 < uVar43);
      puVar8 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      if (literal_split->lengths_alloc_size != 0) {
        memcpy(puVar8,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar8;
      literal_split->lengths_alloc_size = uVar13;
      sVar6 = literal_split->num_blocks;
    }
    literal_split->num_types = 1;
    literal_split->types[sVar6] = '\0';
    sVar6 = literal_split->num_blocks;
    literal_split->lengths[sVar6] = (uint32_t)total_length;
    literal_split->num_blocks = sVar6 + 1;
  }
LAB_0011af5d:
  BrotliFree(m,local_fd8);
  if (num_commands == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = BrotliAllocate(m,num_commands * 2);
  }
  puVar37 = &cmds->cmd_prefix_;
  for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
    *(uint16_t *)((long)pvVar10 + sVar6 * 2) = *puVar37;
    puVar37 = puVar37 + 8;
  }
  uVar43 = (ulong)(ushort)((ushort)num_commands / 0x212 + 1);
  if (0x6783 < num_commands) {
    uVar43 = 0x32;
  }
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
  }
  else {
    if (0x7f < num_commands) {
      pvVar15 = BrotliAllocate(m,uVar43 * 0xb10);
      for (lVar41 = 0; uVar43 * 0xb10 - lVar41 != 0; lVar41 = lVar41 + 0xb10) {
        memset((void *)(lVar41 + (long)pvVar15),0,0xb08);
        *(undefined8 *)((long)pvVar15 + lVar41 + 0xb08) = 0x7ff0000000000000;
      }
      uVar39 = 7;
      for (uVar13 = 0; uVar13 != uVar43; uVar13 = uVar13 + 1) {
        uVar38 = (uVar13 * num_commands) / uVar43;
        if (uVar13 != 0) {
          uVar39 = (ulong)(uint)((int)uVar39 * 0x41a7);
          uVar38 = uVar38 + uVar39 % (num_commands / uVar43);
        }
        if (num_commands <= uVar38 + 0x28) {
          uVar38 = num_commands - 0x29;
        }
        plVar3 = (long *)((long)pvVar15 + uVar13 * 0xb10 + 0xb00);
        *plVar3 = *plVar3 + 0x28;
        for (lVar41 = 0; lVar41 != 0x28; lVar41 = lVar41 + 1) {
          piVar1 = (int *)((long)pvVar15 +
                          (ulong)*(ushort *)((long)pvVar10 + lVar41 * 2 + uVar38 * 2) * 4 +
                          uVar13 * 0xb10);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar13 = (num_commands * 2) / 0x28 + uVar43 + 99;
      uVar39 = 7;
      for (uVar38 = 0; uVar38 < uVar13 - uVar13 % uVar43; uVar38 = uVar38 + 1) {
        memset(local_b40,0,0xb08);
        uVar39 = (ulong)(uint)((int)uVar39 * 0x41a7);
        puVar14 = (ushort *)((long)pvVar10 + (uVar39 % (num_commands - 0x27)) * 2);
        for (lVar41 = -0x28; lVar41 != 0; lVar41 = lVar41 + 1) {
          uVar5 = *puVar14;
          puVar14 = puVar14 + 1;
          *(int *)(local_b40 + (ulong)uVar5 * 4) = *(int *)(local_b40 + (ulong)uVar5 * 4) + 1;
        }
        lVar41 = (uVar38 % uVar43) * 0xb10;
        plVar3 = (long *)((long)pvVar15 + lVar41 + 0xb00);
        *plVar3 = *plVar3 + 0x28;
        for (lVar26 = 0; lVar26 != 0x2c0; lVar26 = lVar26 + 1) {
          piVar1 = (int *)((long)pvVar15 + lVar26 * 4 + lVar41);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
        }
      }
      pvVar17 = BrotliAllocate(m,num_commands);
      iVar24 = (int)uVar43;
      pdVar16 = (double *)BrotliAllocate(m,uVar43 * 0x1600);
      pvVar18 = BrotliAllocate(m,(ulong)(uint)(iVar24 * 8));
      sVar6 = (iVar24 + 7U >> 3) * num_commands;
      if (sVar6 == 0) {
        local_fa8 = (void *)0x0;
      }
      else {
        local_fa8 = BrotliAllocate(m,sVar6);
      }
      pvVar20 = BrotliAllocate(m,(ulong)(uint)(iVar24 * 2));
      lVar41 = 3;
      if (10 < params->quality) {
        lVar41 = 10;
      }
      local_fc8 = 0;
      for (lVar26 = 0; lVar26 != lVar41; lVar26 = lVar26 + 1) {
        if (uVar43 < 2) {
          for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar17 + sVar6) = 0;
          }
          local_fc8 = 1;
        }
        else {
          uVar39 = uVar43 + 7 >> 3;
          memset(pdVar16,0,uVar43 * 0x1600);
          puVar30 = (uint *)((long)pvVar15 + 0xb00);
          for (uVar13 = 0; uVar43 != uVar13; uVar13 = uVar13 + 1) {
            uVar38 = (ulong)*puVar30;
            if (uVar38 < 0x100) {
              dVar46 = (double)kLog2Table[uVar38];
            }
            else {
              dVar46 = log2((double)uVar38);
            }
            pdVar16[uVar13] = dVar46;
            puVar30 = puVar30 + 0x2c4;
          }
          lVar40 = uVar43 * 0x15f8;
          lVar44 = 0x2c0;
          lVar19 = (long)pvVar15 + 0xafc;
          while (bVar45 = lVar44 != 0, lVar44 = lVar44 + -1, bVar45) {
            pdVar32 = pdVar16;
            for (lVar33 = 0; uVar43 * 0x162 - lVar33 != 0; lVar33 = lVar33 + 0x162) {
              dVar46 = *pdVar32;
              uVar4 = *(uint *)(lVar19 + lVar33 * 8);
              uVar13 = (ulong)uVar4;
              dVar47 = -2.0;
              if (uVar13 != 0) {
                if (uVar4 < 0x100) {
                  dVar47 = (double)kLog2Table[uVar13];
                }
                else {
                  dVar47 = log2((double)uVar13);
                }
              }
              *(double *)((long)pdVar32 + lVar40) = dVar46 - dVar47;
              pdVar32 = pdVar32 + 1;
            }
            lVar40 = lVar40 + uVar43 * -8;
            lVar19 = lVar19 + -4;
          }
          memset(pvVar18,0,uVar43 * 8);
          memset(local_fa8,0,uVar39 * num_commands);
          for (uVar13 = 0; uVar13 != num_commands; uVar13 = uVar13 + 1) {
            uVar5 = *(ushort *)((long)pvVar10 + uVar13 * 2);
            dVar46 = 1e+99;
            for (uVar38 = 0; uVar43 != uVar38; uVar38 = uVar38 + 1) {
              dVar47 = pdVar16[uVar5 * uVar43 + uVar38] + *(double *)((long)pvVar18 + uVar38 * 8);
              *(double *)((long)pvVar18 + uVar38 * 8) = dVar47;
              if (dVar47 < dVar46) {
                *(char *)((long)pvVar17 + uVar13) = (char)uVar38;
                dVar46 = dVar47;
              }
            }
            dVar47 = 13.5;
            if (uVar13 < 2000) {
              dVar47 = (((double)(long)uVar13 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            for (uVar38 = 0; uVar43 != uVar38; uVar38 = uVar38 + 1) {
              dVar48 = *(double *)((long)pvVar18 + uVar38 * 8) - dVar46;
              *(double *)((long)pvVar18 + uVar38 * 8) = dVar48;
              if (dVar47 <= dVar48) {
                *(double *)((long)pvVar18 + uVar38 * 8) = dVar47;
                pbVar29 = (byte *)((long)local_fa8 + (uVar38 >> 3) + uVar13 * uVar39);
                *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar38 & 7);
              }
            }
          }
          bVar28 = *(byte *)((long)pvVar17 + (num_commands - 1));
          pvVar11 = (void *)((num_commands - 2) * uVar39 + (long)local_fa8);
          local_fc8 = 1;
          for (sVar6 = num_commands; sVar6 != 1; sVar6 = sVar6 - 1) {
            if ((*(byte *)((long)pvVar11 + (ulong)(bVar28 >> 3)) >> (bVar28 & 7) & 1) != 0) {
              bVar34 = *(byte *)((long)pvVar17 + (sVar6 - 2));
              local_fc8 = local_fc8 + (bVar28 != bVar34);
              bVar28 = bVar34;
            }
            *(byte *)((long)pvVar17 + (sVar6 - 2)) = bVar28;
            pvVar11 = (void *)((long)pvVar11 - uVar39);
          }
        }
        for (uVar39 = 0; uVar43 != uVar39; uVar39 = uVar39 + 1) {
          *(undefined2 *)((long)pvVar20 + uVar39 * 2) = 0x100;
        }
        uVar5 = 0;
        for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
          if (*(short *)((long)pvVar20 + (ulong)*(byte *)((long)pvVar17 + sVar6) * 2) == 0x100) {
            *(ushort *)((long)pvVar20 + (ulong)*(byte *)((long)pvVar17 + sVar6) * 2) = uVar5;
            uVar5 = uVar5 + 1;
          }
        }
        for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
          *(undefined1 *)((long)pvVar17 + sVar6) =
               *(undefined1 *)((long)pvVar20 + (ulong)*(byte *)((long)pvVar17 + sVar6) * 2);
        }
        uVar43 = (ulong)uVar5;
        for (lVar19 = 0; uVar43 * 0xb10 - lVar19 != 0; lVar19 = lVar19 + 0xb10) {
          memset((void *)(lVar19 + (long)pvVar15),0,0xb08);
          *(undefined8 *)((long)pvVar15 + lVar19 + 0xb08) = 0x7ff0000000000000;
        }
        for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
          lVar19 = (ulong)*(byte *)((long)pvVar17 + sVar6) * 0xb10;
          piVar1 = (int *)((long)pvVar15 +
                          (ulong)*(ushort *)((long)pvVar10 + sVar6 * 2) * 4 + lVar19);
          *piVar1 = *piVar1 + 1;
          plVar3 = (long *)((long)pvVar15 + lVar19 + 0xb00);
          *plVar3 = *plVar3 + 1;
        }
      }
      BrotliFree(m,pdVar16);
      BrotliFree(m,pvVar18);
      BrotliFree(m,local_fa8);
      BrotliFree(m,pvVar20);
      BrotliFree(m,pvVar15);
      if (local_fc8 == 0) {
        local_fd8 = (uint32_t *)0x0;
        pvVar15 = (void *)0x0;
      }
      else {
        local_fd8 = (uint32_t *)BrotliAllocate(m,local_fc8 * 4);
        pvVar15 = BrotliAllocate(m,local_fc8 * 4);
      }
      uVar39 = local_fc8 * 0x10 + 0x3f0;
      uVar43 = uVar39 >> 6;
      if (uVar39 < 0x40) {
        local_1000 = (HistogramCommand *)0x0;
        local_fb8 = (uint32_t *)0x0;
      }
      else {
        local_1000 = (HistogramCommand *)BrotliAllocate(m,uVar43 * 0xb10);
        local_fb8 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
      }
      if (local_fc8 == 0) {
        local_fe0 = (HistogramCommand *)0x0;
      }
      else {
        uVar39 = 0x40;
        if (local_fc8 < 0x40) {
          uVar39 = local_fc8;
        }
        local_fe0 = (HistogramCommand *)BrotliAllocate(m,uVar39 * 0xb10);
      }
      local_f78 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar15,0,local_fc8 * 4);
      lVar41 = 0;
      sVar6 = 0;
      while (sVar27 = sVar6 + 1, sVar27 - num_commands != 1) {
        piVar1 = (int *)((long)pvVar15 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar27 == num_commands) ||
           (pcVar2 = (char *)((long)pvVar17 + sVar6), sVar6 = sVar27,
           *pcVar2 != *(char *)((long)pvVar17 + sVar27))) {
          lVar41 = lVar41 + 1;
          sVar6 = sVar27;
        }
      }
      local_f70 = 0;
      total_length = (size_t)local_fd8;
      uVar13 = 0;
      uVar38 = 0;
      local_fb0 = (uint32_t *)0x0;
      local_fa8 = (void *)0x0;
      uVar39 = local_fc8;
      local_f90 = (uint32_t *)uVar43;
      while( true ) {
        uVar21 = 0x40;
        if (uVar39 < 0x40) {
          uVar21 = uVar39;
        }
        uVar35 = local_fc8 - uVar38;
        if (local_fc8 < uVar38 || uVar35 == 0) break;
        for (uVar31 = 0; uVar31 != uVar21; uVar31 = uVar31 + 1) {
          pHVar12 = local_fe0 + uVar31;
          memset(pHVar12,0,0xb08);
          local_fe0[uVar31].bit_cost_ = INFINITY;
          uVar42 = 0;
          while (uVar42 < *(uint *)((long)pvVar15 + (uVar38 + uVar31) * 4)) {
            pHVar12->data_[*(ushort *)((long)pvVar10 + uVar42 * 2 + local_f70 * 2)] =
                 pHVar12->data_[*(ushort *)((long)pvVar10 + uVar42 * 2 + local_f70 * 2)] + 1;
            uVar42 = uVar42 + 1;
            pHVar12->total_count_ = uVar42;
          }
          dVar46 = BrotliPopulationCostCommand(pHVar12);
          pHVar12->bit_cost_ = dVar46;
          new_clusters[uVar31] = (uint32_t)uVar31;
          symbols[uVar31] = (uint32_t)uVar31;
          sizes[uVar31] = 1;
          local_f70 = local_f70 + uVar42;
        }
        if (0x3f < uVar35) {
          uVar35 = 0x40;
        }
        sVar6 = BrotliHistogramCombineCommand
                          (local_fe0,sizes,symbols,new_clusters,local_f78,uVar35,uVar35,0x40,0x800);
        uVar35 = (long)local_fa8 + sVar6;
        if (uVar43 < uVar35) {
          uVar31 = uVar43;
          if (uVar43 == 0) {
            uVar31 = uVar35;
          }
          do {
            uVar42 = uVar31;
            uVar31 = uVar42 * 2;
          } while (uVar42 < uVar35);
          pHVar12 = (HistogramCommand *)BrotliAllocate(m,uVar42 * 0xb10);
          if (uVar43 != 0) {
            memcpy(pHVar12,local_1000,uVar43 * 0xb10);
          }
          BrotliFree(m,local_1000);
          local_1000 = pHVar12;
          uVar43 = uVar42;
        }
        uVar35 = (long)local_fb0 + sVar6;
        if (local_f90 < uVar35) {
          puVar8 = local_f90;
          if (local_f90 == (uint32_t *)0x0) {
            puVar8 = (uint32_t *)uVar35;
          }
          do {
            uVar31 = (ulong)puVar8;
            puVar8 = (uint32_t *)(uVar31 * 2);
          } while (uVar31 < uVar35);
          puVar8 = (uint32_t *)BrotliAllocate(m,uVar31 * 4);
          if (local_f90 != (uint32_t *)0x0) {
            memcpy(puVar8,local_fb8,(long)local_f90 << 2);
          }
          BrotliFree(m,local_fb8);
          local_f90 = (uint32_t *)uVar31;
          local_fb8 = puVar8;
        }
        pHVar12 = local_1000 + (long)local_fa8;
        for (sVar27 = 0; sVar6 != sVar27; sVar27 = sVar27 + 1) {
          uVar4 = new_clusters[sVar27];
          memcpy(pHVar12,local_fe0 + uVar4,0xb10);
          local_fb8[(long)local_fb0 + sVar27] = sizes[uVar4];
          remap[new_clusters[sVar27]] = (uint32_t)sVar27;
          pHVar12 = pHVar12 + 1;
        }
        local_fb0 = (uint32_t *)((long)local_fb0 + sVar27);
        local_fa8 = (void *)((long)local_fa8 + sVar27);
        for (uVar35 = 0; uVar21 != uVar35; uVar35 = uVar35 + 1) {
          *(uint32_t *)(total_length + uVar35 * 4) = remap[symbols[uVar35]] + (int)uVar13;
        }
        uVar13 = uVar13 + sVar6;
        uVar38 = uVar38 + 0x40;
        uVar39 = uVar39 - 0x40;
        total_length = total_length + 0x100;
      }
      BrotliFree(m,local_fe0);
      uVar43 = (uVar13 >> 1) * uVar13;
      if (uVar13 << 6 < uVar43) {
        uVar43 = uVar13 << 6;
      }
      if (0x800 < uVar43) {
        BrotliFree(m,local_f78);
        local_f78 = (HistogramPair *)BrotliAllocate(m,uVar43 * 0x18 + 0x18);
      }
      if (uVar13 == 0) {
        puVar8 = (uint32_t *)0x0;
      }
      else {
        puVar8 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      }
      for (uVar39 = 0; uVar13 != uVar39; uVar39 = uVar39 + 1) {
        puVar8[uVar39] = (uint32_t)uVar39;
      }
      sVar6 = BrotliHistogramCombineCommand
                        (local_1000,local_fb8,local_fd8,puVar8,local_f78,uVar13,local_fc8,0x100,
                         uVar43);
      BrotliFree(m,local_f78);
      BrotliFree(m,local_fb8);
      if (uVar13 == 0) {
        pvVar18 = (void *)0x0;
      }
      else {
        pvVar18 = BrotliAllocate(m,uVar13 * 4);
      }
      for (uVar43 = 0; uVar13 != uVar43; uVar43 = uVar43 + 1) {
        *(undefined4 *)((long)pvVar18 + uVar43 * 4) = 0xffffffff;
      }
      local_ff8 = 0;
      iVar24 = 0;
      for (uVar43 = 0; uVar43 != local_fc8; uVar43 = uVar43 + 1) {
        memset(local_b40,0,0xb08);
        local_38 = INFINITY;
        uVar39 = 0;
        while (uVar39 < *(uint *)((long)pvVar15 + uVar43 * 4)) {
          *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar10 + uVar39 * 2 + local_ff8 * 2) * 4) =
               *(int *)(local_b40 +
                       (ulong)*(ushort *)((long)pvVar10 + uVar39 * 2 + local_ff8 * 2) * 4) + 1;
          uVar39 = uVar39 + 1;
          local_40 = uVar39;
        }
        lVar41 = uVar43 - 1;
        if (uVar43 == 0) {
          lVar41 = 0;
        }
        uVar13 = (ulong)local_fd8[lVar41];
        local_fe0 = (HistogramCommand *)
                    BrotliHistogramBitCostDistanceCommand
                              ((HistogramCommand *)local_b40,local_1000 + uVar13);
        local_ff8 = local_ff8 + uVar39;
        for (sVar27 = 0; sVar6 != sVar27; sVar27 = sVar27 + 1) {
          dVar46 = BrotliHistogramBitCostDistanceCommand
                             ((HistogramCommand *)local_b40,local_1000 + puVar8[sVar27]);
          if (dVar46 < (double)local_fe0) {
            uVar13 = (ulong)puVar8[sVar27];
            local_fe0 = (HistogramCommand *)dVar46;
          }
        }
        local_fd8[uVar43] = (uint32_t)uVar13;
        if (*(int *)((long)pvVar18 + uVar13 * 4) == -1) {
          *(int *)((long)pvVar18 + uVar13 * 4) = iVar24;
          iVar24 = iVar24 + 1;
        }
      }
      BrotliFree(m,puVar8);
      BrotliFree(m,local_1000);
      uVar43 = insert_and_copy_split->types_alloc_size;
      if (uVar43 < local_fc8) {
        if (uVar43 == 0) {
          uVar43 = local_fc8;
        }
        do {
          uVar39 = uVar43;
          uVar43 = uVar39 * 2;
        } while (uVar39 < local_fc8);
        puVar7 = (uint8_t *)BrotliAllocate(m,uVar39);
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar7,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar7;
        insert_and_copy_split->types_alloc_size = uVar39;
      }
      uVar43 = insert_and_copy_split->lengths_alloc_size;
      if (uVar43 < local_fc8) {
        if (uVar43 == 0) {
          uVar43 = local_fc8;
        }
        do {
          uVar39 = uVar43;
          uVar43 = uVar39 * 2;
        } while (uVar39 < local_fc8);
        puVar8 = (uint32_t *)BrotliAllocate(m,uVar39 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar8,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar8;
        insert_and_copy_split->lengths_alloc_size = uVar39;
      }
      uVar39 = 0;
      sVar6 = 0;
      uVar43 = 0;
      do {
        uVar36 = 0;
        uVar13 = uVar39;
        do {
          uVar39 = uVar13 + 1;
          uVar38 = uVar43 & 0xff;
          if (uVar39 - local_fc8 == 1) {
            insert_and_copy_split->num_blocks = sVar6;
            insert_and_copy_split->num_types = uVar38 + 1;
            BrotliFree(m,pvVar18);
            BrotliFree(m,pvVar15);
            BrotliFree(m,local_fd8);
            BrotliFree(m,pvVar17);
            goto LAB_0011c0c4;
          }
          uVar36 = uVar36 + *(int *)((long)pvVar15 + uVar39 * 4 + -4);
          puVar30 = local_fd8 + uVar13;
        } while ((uVar39 != local_fc8) && (uVar13 = uVar39, *puVar30 == local_fd8[uVar39]));
        uVar4 = *(uint *)((long)pvVar18 + (ulong)*puVar30 * 4);
        bVar28 = (byte)uVar4;
        insert_and_copy_split->types[sVar6] = bVar28;
        insert_and_copy_split->lengths[sVar6] = uVar36;
        bVar34 = (byte)uVar43;
        uVar43 = (ulong)uVar4;
        if (bVar28 < bVar34) {
          uVar43 = uVar38;
        }
        sVar6 = sVar6 + 1;
      } while( true );
    }
    sVar6 = insert_and_copy_split->num_blocks;
    uVar39 = insert_and_copy_split->types_alloc_size;
    uVar43 = sVar6 + 1;
    if (uVar39 < uVar43) {
      if (uVar39 == 0) {
        uVar39 = uVar43;
      }
      do {
        uVar13 = uVar39;
        uVar39 = uVar13 * 2;
      } while (uVar13 < uVar43);
      puVar7 = (uint8_t *)BrotliAllocate(m,uVar13);
      if (insert_and_copy_split->types_alloc_size != 0) {
        memcpy(puVar7,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar7;
      insert_and_copy_split->types_alloc_size = uVar13;
      sVar6 = insert_and_copy_split->num_blocks;
      uVar43 = sVar6 + 1;
    }
    uVar39 = insert_and_copy_split->lengths_alloc_size;
    if (uVar39 < uVar43) {
      if (uVar39 == 0) {
        uVar39 = uVar43;
      }
      do {
        uVar13 = uVar39;
        uVar39 = uVar13 * 2;
      } while (uVar13 < uVar43);
      puVar8 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        memcpy(puVar8,insert_and_copy_split->lengths,insert_and_copy_split->lengths_alloc_size << 2)
        ;
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar8;
      insert_and_copy_split->lengths_alloc_size = uVar13;
      sVar6 = insert_and_copy_split->num_blocks;
    }
    insert_and_copy_split->num_types = 1;
    insert_and_copy_split->types[sVar6] = '\0';
    sVar6 = insert_and_copy_split->num_blocks;
    insert_and_copy_split->lengths[sVar6] = (uint32_t)num_commands;
    insert_and_copy_split->num_blocks = sVar6 + 1;
  }
LAB_0011c0c4:
  BrotliFree(m,pvVar10);
  if (num_commands == 0) {
    local_fd8 = (uint32_t *)0x0;
  }
  else {
    local_fd8 = (uint32_t *)BrotliAllocate(m,num_commands * 2);
  }
  puVar37 = &cmds->dist_prefix_;
  total_length = 0;
  while (bVar45 = num_commands != 0, num_commands = num_commands - 1, bVar45) {
    if (((*(uint *)(puVar37 + -5) & 0x1ffffff) != 0) && (0x7f < puVar37[-1])) {
      *(uint16_t *)((long)local_fd8 + total_length * 2) = *puVar37 & 0x3ff;
      total_length = total_length + 1;
    }
    puVar37 = puVar37 + 8;
  }
  local_fe8 = (ulong)(ushort)((ushort)total_length / 0x220 + 1);
  if (0x6a3f < total_length) {
    local_fe8 = 0x32;
  }
  if (total_length == 0) {
    dist_split->num_types = 1;
  }
  else {
    if (0x7f < total_length) {
      pvVar10 = BrotliAllocate(m,local_fe8 * 0x890);
      for (lVar41 = 0; local_fe8 * 0x890 - lVar41 != 0; lVar41 = lVar41 + 0x890) {
        memset((void *)((long)pvVar10 + lVar41),0,0x888);
        *(undefined8 *)((long)pvVar10 + lVar41 + 0x888) = 0x7ff0000000000000;
      }
      uVar43 = 7;
      for (uVar39 = 0; uVar39 != local_fe8; uVar39 = uVar39 + 1) {
        uVar13 = (uVar39 * total_length) / local_fe8;
        if (uVar39 != 0) {
          uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
          uVar13 = uVar13 + uVar43 % (total_length / local_fe8);
        }
        if (total_length <= uVar13 + 0x28) {
          uVar13 = total_length - 0x29;
        }
        plVar3 = (long *)((long)pvVar10 + uVar39 * 0x890 + 0x880);
        *plVar3 = *plVar3 + 0x28;
        for (lVar41 = 0; lVar41 != 0x28; lVar41 = lVar41 + 1) {
          piVar1 = (int *)((long)pvVar10 +
                          (ulong)*(ushort *)((long)local_fd8 + lVar41 * 2 + uVar13 * 2) * 4 +
                          uVar39 * 0x890);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar13 = (total_length * 2) / 0x28 + local_fe8 + 99;
      uVar43 = 7;
      for (uVar39 = 0; uVar39 < uVar13 - uVar13 % local_fe8; uVar39 = uVar39 + 1) {
        memset(local_b40,0,0x888);
        uVar43 = (ulong)(uint)((int)uVar43 * 0x41a7);
        puVar14 = (ushort *)((long)local_fd8 + (uVar43 % (total_length - 0x27)) * 2);
        for (lVar41 = -0x28; lVar41 != 0; lVar41 = lVar41 + 1) {
          uVar5 = *puVar14;
          puVar14 = puVar14 + 1;
          *(int *)(local_b40 + (ulong)uVar5 * 4) = *(int *)(local_b40 + (ulong)uVar5 * 4) + 1;
        }
        lVar41 = (uVar39 % local_fe8) * 0x890;
        plVar3 = (long *)((long)pvVar10 + lVar41 + 0x880);
        *plVar3 = *plVar3 + 0x28;
        for (lVar26 = 0; lVar26 != 0x220; lVar26 = lVar26 + 1) {
          piVar1 = (int *)((long)pvVar10 + lVar26 * 4 + lVar41);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
        }
      }
      pvVar15 = BrotliAllocate(m,total_length);
      iVar24 = (int)local_fe8;
      pdVar16 = (double *)BrotliAllocate(m,local_fe8 * 0x1100);
      pvVar17 = BrotliAllocate(m,(ulong)(uint)(iVar24 * 8));
      sVar6 = (iVar24 + 7U >> 3) * total_length;
      if (sVar6 == 0) {
        local_fa8 = (void *)0x0;
      }
      else {
        local_fa8 = BrotliAllocate(m,sVar6);
      }
      pvVar18 = BrotliAllocate(m,(ulong)(uint)(iVar24 * 2));
      if (10 < params->quality) {
        local_f50 = 10;
      }
      local_fc8 = 0;
      for (lVar41 = 0; lVar41 != local_f50; lVar41 = lVar41 + 1) {
        if (local_fe8 < 2) {
          for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar15 + sVar6) = 0;
          }
          local_fc8 = 1;
        }
        else {
          uVar39 = local_fe8 + 7 >> 3;
          memset(pdVar16,0,local_fe8 * 0x1100);
          puVar30 = (uint *)((long)pvVar10 + 0x880);
          for (uVar43 = 0; local_fe8 != uVar43; uVar43 = uVar43 + 1) {
            uVar13 = (ulong)*puVar30;
            if (uVar13 < 0x100) {
              dVar46 = (double)kLog2Table[uVar13];
            }
            else {
              dVar46 = log2((double)uVar13);
            }
            pdVar16[uVar43] = dVar46;
            puVar30 = puVar30 + 0x224;
          }
          lVar44 = local_fe8 * 0x10f8;
          lVar19 = 0x220;
          lVar26 = (long)pvVar10 + 0x87c;
          while (bVar45 = lVar19 != 0, lVar19 = lVar19 + -1, bVar45) {
            pdVar32 = pdVar16;
            for (lVar40 = 0; local_fe8 * 0x112 - lVar40 != 0; lVar40 = lVar40 + 0x112) {
              dVar46 = *pdVar32;
              uVar4 = *(uint *)(lVar26 + lVar40 * 8);
              uVar43 = (ulong)uVar4;
              dVar47 = -2.0;
              if (uVar43 != 0) {
                if (uVar4 < 0x100) {
                  dVar47 = (double)kLog2Table[uVar43];
                }
                else {
                  dVar47 = log2((double)uVar43);
                }
              }
              *(double *)((long)pdVar32 + lVar44) = dVar46 - dVar47;
              pdVar32 = pdVar32 + 1;
            }
            lVar44 = lVar44 + local_fe8 * -8;
            lVar26 = lVar26 + -4;
          }
          memset(pvVar17,0,local_fe8 * 8);
          memset(local_fa8,0,uVar39 * total_length);
          for (uVar43 = 0; uVar43 != total_length; uVar43 = uVar43 + 1) {
            uVar5 = *(ushort *)((long)local_fd8 + uVar43 * 2);
            dVar46 = 1e+99;
            for (uVar13 = 0; local_fe8 != uVar13; uVar13 = uVar13 + 1) {
              dVar47 = pdVar16[uVar5 * local_fe8 + uVar13] + *(double *)((long)pvVar17 + uVar13 * 8)
              ;
              *(double *)((long)pvVar17 + uVar13 * 8) = dVar47;
              if (dVar47 < dVar46) {
                *(char *)((long)pvVar15 + uVar43) = (char)uVar13;
                dVar46 = dVar47;
              }
            }
            dVar47 = (double)0x402d333333333333;
            if (uVar43 < 2000) {
              dVar47 = (((double)(long)uVar43 * 0.07) / 2000.0 + 0.77) * (double)0x402d333333333333;
            }
            for (uVar13 = 0; local_fe8 != uVar13; uVar13 = uVar13 + 1) {
              dVar48 = *(double *)((long)pvVar17 + uVar13 * 8) - dVar46;
              *(double *)((long)pvVar17 + uVar13 * 8) = dVar48;
              if (dVar47 <= dVar48) {
                *(double *)((long)pvVar17 + uVar13 * 8) = dVar47;
                pbVar29 = (byte *)((long)local_fa8 + (uVar13 >> 3) + uVar43 * uVar39);
                *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar13 & 7);
              }
            }
          }
          bVar28 = *(byte *)((long)pvVar15 + (total_length - 1));
          pvVar20 = (void *)((total_length - 2) * uVar39 + (long)local_fa8);
          local_fc8 = 1;
          for (sVar6 = total_length; sVar6 != 1; sVar6 = sVar6 - 1) {
            if ((*(byte *)((long)pvVar20 + (ulong)(bVar28 >> 3)) >> (bVar28 & 7) & 1) != 0) {
              bVar34 = *(byte *)((long)pvVar15 + (sVar6 - 2));
              local_fc8 = local_fc8 + (bVar28 != bVar34);
              bVar28 = bVar34;
            }
            *(byte *)((long)pvVar15 + (sVar6 - 2)) = bVar28;
            pvVar20 = (void *)((long)pvVar20 - uVar39);
          }
        }
        for (uVar43 = 0; local_fe8 != uVar43; uVar43 = uVar43 + 1) {
          *(undefined2 *)((long)pvVar18 + uVar43 * 2) = 0x100;
        }
        uVar5 = 0;
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          if (*(short *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar15 + sVar6) * 2) == 0x100) {
            *(ushort *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar15 + sVar6) * 2) = uVar5;
            uVar5 = uVar5 + 1;
          }
        }
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          *(undefined1 *)((long)pvVar15 + sVar6) =
               *(undefined1 *)((long)pvVar18 + (ulong)*(byte *)((long)pvVar15 + sVar6) * 2);
        }
        local_fe8 = (ulong)uVar5;
        for (lVar26 = 0; local_fe8 * 0x890 - lVar26 != 0; lVar26 = lVar26 + 0x890) {
          memset((void *)((long)pvVar10 + lVar26),0,0x888);
          *(undefined8 *)((long)pvVar10 + lVar26 + 0x888) = 0x7ff0000000000000;
        }
        for (sVar6 = 0; total_length != sVar6; sVar6 = sVar6 + 1) {
          lVar26 = (ulong)*(byte *)((long)pvVar15 + sVar6) * 0x890;
          piVar1 = (int *)((long)pvVar10 +
                          (ulong)*(ushort *)((long)local_fd8 + sVar6 * 2) * 4 + lVar26);
          *piVar1 = *piVar1 + 1;
          plVar3 = (long *)((long)pvVar10 + lVar26 + 0x880);
          *plVar3 = *plVar3 + 1;
        }
      }
      BrotliFree(m,pdVar16);
      BrotliFree(m,pvVar17);
      BrotliFree(m,local_fa8);
      BrotliFree(m,pvVar18);
      BrotliFree(m,pvVar10);
      if (local_fc8 == 0) {
        puVar8 = (uint32_t *)0x0;
        pvVar10 = (void *)0x0;
      }
      else {
        puVar8 = (uint32_t *)BrotliAllocate(m,local_fc8 * 4);
        pvVar10 = BrotliAllocate(m,local_fc8 * 4);
      }
      uVar39 = local_fc8 * 0x10 + 0x3f0;
      uVar43 = uVar39 >> 6;
      if (uVar39 < 0x40) {
        local_ff0 = (HistogramDistance *)0x0;
        local_f90 = (uint32_t *)0x0;
      }
      else {
        local_ff0 = (HistogramDistance *)BrotliAllocate(m,uVar43 * 0x890);
        local_f90 = (uint32_t *)BrotliAllocate(m,uVar43 * 4);
      }
      if (local_fc8 == 0) {
        local_fe0 = (HistogramCommand *)0x0;
      }
      else {
        uVar39 = 0x40;
        if (local_fc8 < 0x40) {
          uVar39 = local_fc8;
        }
        local_fe0 = (HistogramCommand *)BrotliAllocate(m,uVar39 * 0x890);
      }
      local_f78 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar10,0,local_fc8 * 4);
      lVar41 = 0;
      sVar6 = 0;
      while (sVar27 = sVar6 + 1, sVar27 - total_length != 1) {
        piVar1 = (int *)((long)pvVar10 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar27 == total_length) ||
           (pcVar2 = (char *)((long)pvVar15 + sVar6), sVar6 = sVar27,
           *pcVar2 != *(char *)((long)pvVar15 + sVar27))) {
          lVar41 = lVar41 + 1;
          sVar6 = sVar27;
        }
      }
      local_ff8 = 0;
      uVar13 = 0;
      uVar38 = 0;
      local_fa8 = (void *)0x0;
      local_fa0 = (void *)0x0;
      uVar39 = local_fc8;
      total_length = (size_t)puVar8;
      local_f70 = uVar43;
      while( true ) {
        uVar21 = 0x40;
        if (uVar39 < 0x40) {
          uVar21 = uVar39;
        }
        uVar35 = local_fc8 - uVar38;
        if (local_fc8 < uVar38 || uVar35 == 0) break;
        for (uVar31 = 0; uVar31 != uVar21; uVar31 = uVar31 + 1) {
          pHVar22 = (HistogramDistance *)((long)local_fe0 + uVar31 * 0x890);
          memset(pHVar22,0,0x888);
          ((HistogramDistance *)((long)local_fe0 + uVar31 * 0x890))->bit_cost_ = INFINITY;
          uVar42 = 0;
          while (uVar42 < *(uint *)((long)pvVar10 + (uVar38 + uVar31) * 4)) {
            pHVar22->data_[*(ushort *)((long)local_fd8 + uVar42 * 2 + local_ff8 * 2)] =
                 pHVar22->data_[*(ushort *)((long)local_fd8 + uVar42 * 2 + local_ff8 * 2)] + 1;
            uVar42 = uVar42 + 1;
            pHVar22->total_count_ = uVar42;
          }
          dVar46 = BrotliPopulationCostDistance(pHVar22);
          pHVar22->bit_cost_ = dVar46;
          new_clusters[uVar31] = (uint32_t)uVar31;
          symbols[uVar31] = (uint32_t)uVar31;
          sizes[uVar31] = 1;
          local_ff8 = local_ff8 + uVar42;
        }
        if (0x3f < uVar35) {
          uVar35 = 0x40;
        }
        sVar6 = BrotliHistogramCombineDistance
                          ((HistogramDistance *)local_fe0,sizes,symbols,new_clusters,local_f78,
                           uVar35,uVar35,0x40,0x800);
        uVar35 = (long)local_fa0 + sVar6;
        if (local_f70 < uVar35) {
          uVar31 = local_f70;
          if (local_f70 == 0) {
            uVar31 = uVar35;
          }
          do {
            uVar42 = uVar31;
            uVar31 = uVar42 * 2;
          } while (uVar42 < uVar35);
          pHVar22 = (HistogramDistance *)BrotliAllocate(m,uVar42 * 0x890);
          if (local_f70 != 0) {
            memcpy(pHVar22,local_ff0,local_f70 * 0x890);
          }
          BrotliFree(m,local_ff0);
          local_f70 = uVar42;
          local_ff0 = pHVar22;
        }
        uVar35 = (long)local_fa8 + sVar6;
        if (uVar43 < uVar35) {
          uVar31 = uVar43;
          if (uVar43 == 0) {
            uVar31 = uVar35;
          }
          do {
            uVar42 = uVar31;
            uVar31 = uVar42 * 2;
          } while (uVar42 < uVar35);
          puVar23 = (uint32_t *)BrotliAllocate(m,uVar42 * 4);
          if (uVar43 != 0) {
            memcpy(puVar23,local_f90,uVar43 << 2);
          }
          BrotliFree(m,local_f90);
          local_f90 = puVar23;
          uVar43 = uVar42;
        }
        pHVar22 = local_ff0 + (long)local_fa0;
        for (sVar27 = 0; sVar6 != sVar27; sVar27 = sVar27 + 1) {
          uVar4 = new_clusters[sVar27];
          memcpy(pHVar22,(HistogramDistance *)((long)local_fe0 + (ulong)uVar4 * 0x890),0x890);
          local_f90[(long)local_fa8 + sVar27] = sizes[uVar4];
          remap[new_clusters[sVar27]] = (uint32_t)sVar27;
          pHVar22 = pHVar22 + 1;
        }
        local_fa8 = (void *)((long)local_fa8 + sVar27);
        local_fa0 = (void *)((long)local_fa0 + sVar27);
        for (uVar35 = 0; uVar21 != uVar35; uVar35 = uVar35 + 1) {
          *(uint32_t *)(total_length + uVar35 * 4) = remap[symbols[uVar35]] + (int)uVar13;
        }
        uVar13 = uVar13 + sVar6;
        uVar38 = uVar38 + 0x40;
        uVar39 = uVar39 - 0x40;
        total_length = total_length + 0x100;
      }
      BrotliFree(m,local_fe0);
      uVar43 = (uVar13 >> 1) * uVar13;
      if (uVar13 << 6 < uVar43) {
        uVar43 = uVar13 << 6;
      }
      if (0x800 < uVar43) {
        BrotliFree(m,local_f78);
        local_f78 = (HistogramPair *)BrotliAllocate(m,uVar43 * 0x18 + 0x18);
      }
      if (uVar13 == 0) {
        puVar23 = (uint32_t *)0x0;
      }
      else {
        puVar23 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      }
      for (uVar39 = 0; uVar13 != uVar39; uVar39 = uVar39 + 1) {
        puVar23[uVar39] = (uint32_t)uVar39;
      }
      sVar6 = BrotliHistogramCombineDistance
                        (local_ff0,local_f90,puVar8,puVar23,local_f78,uVar13,local_fc8,0x100,uVar43)
      ;
      BrotliFree(m,local_f78);
      BrotliFree(m,local_f90);
      if (uVar13 == 0) {
        pvVar17 = (void *)0x0;
      }
      else {
        pvVar17 = BrotliAllocate(m,uVar13 * 4);
      }
      for (uVar43 = 0; uVar13 != uVar43; uVar43 = uVar43 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar43 * 4) = 0xffffffff;
      }
      local_ff8 = 0;
      iVar24 = 0;
      for (uVar43 = 0; uVar43 != local_fc8; uVar43 = uVar43 + 1) {
        memset(local_b40,0,0x888);
        local_2b8 = INFINITY;
        uVar39 = 0;
        while (uVar39 < *(uint *)((long)pvVar10 + uVar43 * 4)) {
          *(int *)(local_b40 + (ulong)*(ushort *)((long)local_fd8 + uVar39 * 2 + local_ff8 * 2) * 4)
               = *(int *)(local_b40 +
                         (ulong)*(ushort *)((long)local_fd8 + uVar39 * 2 + local_ff8 * 2) * 4) + 1;
          uVar39 = uVar39 + 1;
          local_2c0 = uVar39;
        }
        lVar41 = uVar43 - 1;
        if (uVar43 == 0) {
          lVar41 = 0;
        }
        uVar13 = (ulong)puVar8[lVar41];
        local_fe0 = (HistogramCommand *)
                    BrotliHistogramBitCostDistanceDistance
                              ((HistogramDistance *)local_b40,local_ff0 + uVar13);
        local_ff8 = local_ff8 + uVar39;
        for (sVar27 = 0; sVar6 != sVar27; sVar27 = sVar27 + 1) {
          dVar46 = BrotliHistogramBitCostDistanceDistance
                             ((HistogramDistance *)local_b40,local_ff0 + puVar23[sVar27]);
          if (dVar46 < (double)local_fe0) {
            uVar13 = (ulong)puVar23[sVar27];
            local_fe0 = (HistogramCommand *)dVar46;
          }
        }
        puVar8[uVar43] = (uint32_t)uVar13;
        if (*(int *)((long)pvVar17 + uVar13 * 4) == -1) {
          *(int *)((long)pvVar17 + uVar13 * 4) = iVar24;
          iVar24 = iVar24 + 1;
        }
      }
      BrotliFree(m,puVar23);
      BrotliFree(m,local_ff0);
      uVar43 = dist_split->types_alloc_size;
      if (uVar43 < local_fc8) {
        if (uVar43 == 0) {
          uVar43 = local_fc8;
        }
        do {
          uVar39 = uVar43;
          uVar43 = uVar39 * 2;
        } while (uVar39 < local_fc8);
        puVar7 = (uint8_t *)BrotliAllocate(m,uVar39);
        if (dist_split->types_alloc_size != 0) {
          memcpy(puVar7,dist_split->types,dist_split->types_alloc_size);
        }
        BrotliFree(m,dist_split->types);
        dist_split->types = puVar7;
        dist_split->types_alloc_size = uVar39;
      }
      uVar43 = dist_split->lengths_alloc_size;
      if (uVar43 < local_fc8) {
        if (uVar43 == 0) {
          uVar43 = local_fc8;
        }
        do {
          uVar39 = uVar43;
          uVar43 = uVar39 * 2;
        } while (uVar39 < local_fc8);
        puVar23 = (uint32_t *)BrotliAllocate(m,uVar39 * 4);
        if (dist_split->lengths_alloc_size != 0) {
          memcpy(puVar23,dist_split->lengths,dist_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,dist_split->lengths);
        dist_split->lengths = puVar23;
        dist_split->lengths_alloc_size = uVar39;
      }
      uVar39 = 0;
      sVar6 = 0;
      uVar43 = 0;
      do {
        uVar36 = 0;
        uVar13 = uVar39;
        do {
          uVar39 = uVar13 + 1;
          uVar38 = uVar43 & 0xff;
          if (uVar39 - local_fc8 == 1) {
            dist_split->num_blocks = sVar6;
            dist_split->num_types = uVar38 + 1;
            BrotliFree(m,pvVar17);
            BrotliFree(m,pvVar10);
            BrotliFree(m,puVar8);
            BrotliFree(m,pvVar15);
            goto LAB_0011d23f;
          }
          uVar36 = uVar36 + *(int *)((long)pvVar10 + uVar39 * 4 + -4);
          puVar30 = puVar8 + uVar13;
        } while ((uVar39 != local_fc8) && (uVar13 = uVar39, *puVar30 == puVar8[uVar39]));
        uVar4 = *(uint *)((long)pvVar17 + (ulong)*puVar30 * 4);
        bVar28 = (byte)uVar4;
        dist_split->types[sVar6] = bVar28;
        dist_split->lengths[sVar6] = uVar36;
        bVar34 = (byte)uVar43;
        uVar43 = (ulong)uVar4;
        if (bVar28 < bVar34) {
          uVar43 = uVar38;
        }
        sVar6 = sVar6 + 1;
      } while( true );
    }
    sVar6 = dist_split->num_blocks;
    uVar39 = dist_split->types_alloc_size;
    uVar43 = sVar6 + 1;
    if (uVar39 < uVar43) {
      if (uVar39 == 0) {
        uVar39 = uVar43;
      }
      do {
        uVar13 = uVar39;
        uVar39 = uVar13 * 2;
      } while (uVar13 < uVar43);
      puVar7 = (uint8_t *)BrotliAllocate(m,uVar13);
      if (dist_split->types_alloc_size != 0) {
        memcpy(puVar7,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar7;
      dist_split->types_alloc_size = uVar13;
      sVar6 = dist_split->num_blocks;
      uVar43 = sVar6 + 1;
    }
    uVar39 = dist_split->lengths_alloc_size;
    if (uVar39 < uVar43) {
      if (uVar39 == 0) {
        uVar39 = uVar43;
      }
      do {
        uVar13 = uVar39;
        uVar39 = uVar13 * 2;
      } while (uVar13 < uVar43);
      puVar8 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      if (dist_split->lengths_alloc_size != 0) {
        memcpy(puVar8,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar8;
      dist_split->lengths_alloc_size = uVar13;
      sVar6 = dist_split->num_blocks;
    }
    dist_split->num_types = 1;
    dist_split->types[sVar6] = '\0';
    sVar6 = dist_split->num_blocks;
    dist_split->lengths[sVar6] = (uint32_t)total_length;
    dist_split->num_blocks = sVar6 + 1;
  }
LAB_0011d23f:
  BrotliFree(m,local_fd8);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
       Literal histograms have alphabet size 256. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}